

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O1

int __thiscall QTextFragment::position(QTextFragment *this)

{
  uint *puVar1;
  Header *pHVar2;
  int iVar3;
  uint p;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  iVar3 = 0;
  if ((this->p != (QTextDocumentPrivate *)0x0) &&
     (uVar4 = (ulong)(uint)this->n, iVar3 = 0, uVar4 != 0)) {
    pHVar2 = (this->p->fragments).data.field_0.head;
    iVar3 = *(int *)((long)pHVar2 + uVar4 * 0x20 + 0x10);
    uVar6 = *(uint *)((long)pHVar2 + uVar4 * 0x20);
    while (uVar6 != 0) {
      uVar5 = (ulong)uVar6;
      puVar1 = (uint *)((long)pHVar2 + (ulong)uVar6 * 0x20);
      if (*(int *)((long)pHVar2 + (ulong)uVar6 * 0x20 + 8) == (int)uVar4) {
        iVar3 = iVar3 + puVar1[4] + puVar1[5];
      }
      uVar4 = uVar5;
      uVar6 = *puVar1;
    }
  }
  return iVar3;
}

Assistant:

int QTextFragment::position() const
{
    if (!p || !n)
        return 0; // ### -1 instead?

    return p->fragmentMap().position(n);
}